

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa.cpp
# Opt level: O2

void __thiscall mocker::SSADestruction::replacePhisWithParallelCopies(SSADestruction *this)

{
  shared_ptr<mocker::ir::Addr> *psVar1;
  list<mocker::SSADestruction::Copy,std::allocator<mocker::SSADestruction::Copy>> *this_00;
  shared_ptr<mocker::ir::Addr> *__args_1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::Phi> phi;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  preds;
  __shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> local_d0;
  long local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  _List_node_base *local_b0;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_a8;
  _List_node_base *local_a0;
  _List_node_base *local_98;
  _List_node_base *local_90;
  _List_node_base *local_88;
  _func_int **local_80;
  __shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  buildBlockPredecessors
            ((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)&local_68,(this->super_FuncPass).func);
  p_Var2 = (_List_node_base *)&((this->super_FuncPass).func)->bbs;
  local_a8 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->addresses;
  local_b0 = p_Var2;
  do {
    p_Var2 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
              &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == local_b0) {
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      return;
    }
    local_98 = (_List_node_base *)&p_Var2[1]._M_prev;
    p_Var3 = local_98;
    local_a0 = p_Var2;
    while (p_Var2 = local_a0, p_Var3 = p_Var3->_M_next, p_Var3 != local_98) {
      ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
                ((ir *)&local_c0,(shared_ptr<mocker::ir::IRInst> *)(p_Var3 + 1));
      if (local_c0 == 0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
        break;
      }
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_e0,
                 (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 0x18));
      ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&local_d0);
      local_90 = p_Var3 + 1;
      local_88 = p_Var3;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
      psVar1 = *(shared_ptr<mocker::ir::Addr> **)(local_c0 + 0x30);
      for (__args_1 = *(shared_ptr<mocker::ir::Addr> **)(local_c0 + 0x28); __args_1 != psVar1;
          __args_1 = __args_1 + 2) {
        local_80 = __args_1[1].super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr[1]._vptr_Addr;
        this_00 = (list<mocker::SSADestruction::Copy,std::allocator<mocker::SSADestruction::Copy>> *
                  )std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->parallelCopies,(key_type *)&local_80);
        std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mocker::ir::Reg,void>(local_78,&local_d0);
        ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&local_e0);
        std::__cxx11::
        list<mocker::SSADestruction::Copy,std::allocator<mocker::SSADestruction::Copy>>::
        emplace_back<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Addr>const&>
                  (this_00,(shared_ptr<mocker::ir::Reg> *)&local_e0,__args_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
      }
      std::__detail::
      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
      ::at(local_a8,&(local_d0._M_ptr)->identifier);
      std::
      make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                ((shared_ptr<mocker::ir::Reg> *)&local_e0,(shared_ptr<mocker::ir::Reg> *)&local_d0);
      std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)local_90,&local_e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
      p_Var3 = local_88;
    }
  } while( true );
}

Assistant:

void SSADestruction::replacePhisWithParallelCopies() {
  auto preds = buildBlockPredecessors(func);

  for (auto &bb : func.getMutableBBs()) {
    for (auto &inst : bb.getMutableInsts()) {
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;

      auto dest = ir::dycLocalReg(phi->getDest());
      for (auto &option : phi->getOptions())
        parallelCopies[option.second->getID()].emplace_back(
            ir::dycLocalReg(dest), option.first);
      inst =
          std::make_shared<ir::Load>(dest, addresses.at(dest->getIdentifier()));
    }
  }
}